

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyweight.cpp
# Opt level: O0

string * __thiscall User::get_item_abi_cxx11_(string *__return_storage_ptr__,User *this,key k)

{
  type_conflict1 tVar1;
  runtime_error *this_00;
  pointer psVar2;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  type local_28;
  type local_20;
  iterator it;
  key k_local;
  
  it.super_type.m_iterator.node._4_4_ = (uint)this;
  local_20.m_iterator.node =
       (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
        )boost::bimaps::container_adaptor::associative_container_adaptor<$5a21700e$>::
         find<unsigned_int>((associative_container_adaptor<_5a21700e_> *)
                            &name_storage_abi_cxx11_.left,
                            (uint *)((long)&it.super_type.m_iterator.node + 4));
  local_28.m_iterator.node =
       (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
        )boost::bimaps::container_adaptor::container_adaptor<$b8da75c3$>::end
                   ((container_adaptor<_b8da75c3_> *)&name_storage_abi_cxx11_.left);
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::bidirectional_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long>
                      *)&local_20,
                     (iterator_facade<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::bidirectional_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long>
                      *)&local_28);
  if (!tVar1) {
    psVar2 = boost::iterators::detail::
             iterator_facade_base<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::bidirectional_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::bidirectional_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long,_false,_false>
                           *)&local_20);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(psVar2 + 8));
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_88,it.super_type.m_iterator.node._4_4_);
  std::operator+(&local_68,"Key ",&local_88);
  std::operator+(&local_48,&local_68," not in name storage");
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::string get_item(key k)
	{
		auto it{name_storage.left.find(k)};
		if(it == name_storage.left.end())
		{
			throw std::runtime_error{"Key " + std::to_string(k) + " not in name storage"};
		}

		return it->second;
	}